

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O1

Vec3fa __thiscall
embree::MetalMaterial__eval
          (embree *this,ISPCMetalMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float __y;
  undefined8 in_XMM1_Qa;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar35 [16];
  float fVar37;
  undefined1 auVar38 [16];
  Vec3fa VVar39;
  undefined1 auVar34 [16];
  
  fVar2 = (wo->field_0).m128[3];
  fVar5 = (dg->Ns).field_0.m128[0];
  fVar6 = (dg->Ns).field_0.m128[1];
  fVar7 = (dg->Ns).field_0.m128[2];
  fVar3 = (dg->Ns).field_0.m128[3];
  fVar8 = (wo->field_0).m128[1] * fVar6;
  fVar14 = fVar8 + (wo->field_0).m128[0] * fVar5 + (wo->field_0).m128[2] * fVar7;
  fVar4 = 0.0;
  fVar26 = 0.0;
  fVar27 = 0.0;
  fVar29 = 0.0;
  fVar31 = 0.0;
  if (0.0 < fVar14) {
    fVar9 = (wi->field_0).m128[0];
    fVar10 = (wi->field_0).m128[1];
    fVar11 = (wi->field_0).m128[2];
    fVar12 = fVar6 * fVar10;
    fVar13 = fVar3 * (wi->field_0).m128[3];
    in_XMM1_Qa = CONCAT44(fVar13,fVar7 * fVar11);
    fVar32 = fVar12 + fVar5 * fVar9 + fVar7 * fVar11;
    if (0.0 < fVar32) {
      fVar4 = This->roughness;
      auVar15 = rcpss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
      __y = (2.0 - fVar4 * auVar15._0_4_) * auVar15._0_4_;
      fVar4 = (This->eta).field_0.m128[0];
      fVar26 = (This->eta).field_0.m128[1];
      fVar27 = (This->eta).field_0.m128[2];
      fVar31 = (This->eta).field_0.m128[3];
      fVar29 = (This->k).field_0.m128[0];
      fVar17 = (This->k).field_0.m128[1];
      fVar18 = (This->k).field_0.m128[2];
      fVar20 = (This->k).field_0.m128[3];
      fVar19 = (wo->field_0).m128[0] + fVar9;
      fVar23 = (wo->field_0).m128[1] + fVar10;
      fVar24 = (wo->field_0).m128[2] + fVar11;
      fVar25 = fVar2 + (wi->field_0).m128[3];
      fVar28 = fVar23 * fVar23;
      fVar30 = fVar24 * fVar24;
      fVar25 = fVar25 * fVar25;
      fVar33 = fVar28 + fVar19 * fVar19 + fVar30;
      auVar34._0_8_ = CONCAT44(fVar28 + fVar28 + fVar25,fVar33);
      auVar34._8_4_ = fVar28 + fVar30 + fVar30;
      auVar34._12_4_ = fVar28 + fVar25 + fVar25;
      auVar38._8_4_ = auVar34._8_4_;
      auVar38._0_8_ = auVar34._0_8_;
      auVar38._12_4_ = auVar34._12_4_;
      auVar15 = rsqrtss(auVar38,auVar34);
      fVar25 = auVar15._0_4_;
      fVar28 = fVar25 * 1.5 - fVar25 * fVar25 * fVar33 * 0.5 * fVar25;
      fVar25 = fVar7 * fVar28 * fVar24 + fVar6 * fVar28 * fVar23 + fVar5 * fVar28 * fVar19;
      auVar35._0_4_ = fVar28 * fVar23 * fVar10 + fVar28 * fVar19 * fVar9 + fVar28 * fVar24 * fVar11;
      auVar16._0_4_ = fVar29 * fVar29 + fVar4 * fVar4;
      auVar16._4_4_ = fVar17 * fVar17 + fVar26 * fVar26;
      auVar16._8_4_ = fVar18 * fVar18 + fVar27 * fVar27;
      auVar16._12_4_ = fVar20 * fVar20 + fVar31 * fVar31;
      fVar20 = auVar35._0_4_ * auVar35._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      fVar5 = (fVar4 + fVar4) * auVar35._0_4_;
      fVar4 = (fVar26 + fVar26) * auVar35._0_4_;
      fVar29 = (fVar27 + fVar27) * auVar35._0_4_;
      fVar10 = (fVar31 + fVar31) * auVar35._0_4_;
      fVar19 = fVar5 + auVar16._0_4_ * fVar20 + 1.0;
      fVar23 = fVar4 + auVar16._4_4_ * fVar20 + 1.0;
      fVar24 = fVar29 + auVar16._8_4_ * fVar20 + 1.0;
      fVar28 = fVar10 + auVar16._12_4_ * fVar20 + 1.0;
      auVar1._4_4_ = fVar23;
      auVar1._0_4_ = fVar19;
      auVar1._8_4_ = fVar24;
      auVar1._12_4_ = fVar28;
      auVar15 = rcpps(auVar35,auVar1);
      fVar30 = auVar15._0_4_;
      fVar33 = auVar15._4_4_;
      fVar36 = auVar15._8_4_;
      fVar37 = auVar15._12_4_;
      fVar6 = fVar5 + auVar16._0_4_ + fVar20;
      fVar27 = fVar4 + auVar16._4_4_ + fVar20;
      fVar9 = fVar29 + auVar16._8_4_ + fVar20;
      fVar11 = fVar10 + auVar16._12_4_ + fVar20;
      auVar15._4_4_ = fVar27;
      auVar15._0_4_ = fVar6;
      auVar15._8_4_ = fVar9;
      auVar15._12_4_ = fVar11;
      auVar15 = rcpps(auVar16,auVar15);
      fVar26 = auVar15._0_4_;
      fVar31 = auVar15._4_4_;
      fVar17 = auVar15._8_4_;
      fVar18 = auVar15._12_4_;
      fVar7 = powf(ABS(fVar25),__y);
      fVar7 = fVar7 * (__y + 2.0) * 0.15915494;
      fVar25 = fVar25 + fVar25;
      auVar21._0_4_ = fVar25 * fVar14;
      auVar21._4_4_ = fVar25 * fVar32;
      auVar21._8_4_ = fVar25 * (fVar8 + fVar8 + fVar2 * fVar3);
      auVar21._12_4_ = fVar25 * (fVar12 + fVar12 + fVar13);
      auVar22 = divps(auVar21,auVar35);
      if (auVar22._4_4_ <= auVar22._0_4_) {
        auVar22._0_4_ = auVar22._4_4_;
      }
      fVar2 = 1.0;
      if (auVar22._0_4_ <= 1.0) {
        fVar2 = auVar22._0_4_;
      }
      fVar26 = fVar2 * fVar7 * (((1.0 - fVar6 * fVar26) * fVar26 + fVar26) *
                                ((auVar16._0_4_ - fVar5) + fVar20) +
                               ((1.0 - fVar19 * fVar30) * fVar30 + fVar30) *
                               ((auVar16._0_4_ * fVar20 - fVar5) + 1.0)) * 0.5 *
                               (This->reflectance).field_0.m128[0];
      fVar27 = fVar2 * fVar7 * (((1.0 - fVar27 * fVar31) * fVar31 + fVar31) *
                                ((auVar16._4_4_ - fVar4) + fVar20) +
                               ((1.0 - fVar23 * fVar33) * fVar33 + fVar33) *
                               ((auVar16._4_4_ * fVar20 - fVar4) + 1.0)) * 0.5 *
                               (This->reflectance).field_0.m128[1];
      in_XMM1_Qa = CONCAT44(fVar27,fVar26);
      fVar14 = fVar14 * 4.0;
      auVar15 = rcpss(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
      fVar4 = fVar14 * auVar15._0_4_;
      fVar31 = (2.0 - fVar4) * auVar15._0_4_;
      fVar26 = fVar31 * fVar26;
      fVar27 = fVar31 * fVar27;
      fVar29 = fVar31 * fVar2 * fVar7 * (((1.0 - fVar9 * fVar17) * fVar17 + fVar17) *
                                         ((auVar16._8_4_ - fVar29) + fVar20) +
                                        ((1.0 - fVar24 * fVar36) * fVar36 + fVar36) *
                                        ((auVar16._8_4_ * fVar20 - fVar29) + 1.0)) * 0.5 *
                                        (This->reflectance).field_0.m128[2];
      fVar31 = fVar31 * fVar2 * fVar7 * (((1.0 - fVar11 * fVar18) * fVar18 + fVar18) *
                                         ((auVar16._12_4_ - fVar10) + fVar20) +
                                        ((1.0 - fVar28 * fVar37) * fVar37 + fVar37) *
                                        ((auVar16._12_4_ * fVar20 - fVar10) + 1.0)) * 0.5 *
                                        (This->reflectance).field_0.m128[3];
    }
  }
  *(float *)this = fVar26;
  *(float *)(this + 4) = fVar27;
  *(float *)(this + 8) = fVar29;
  *(float *)(this + 0xc) = fVar31;
  VVar39.field_0.m128[1] = 0.0;
  VVar39.field_0.m128[0] = fVar4;
  VVar39.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar39.field_0;
}

Assistant:

Vec3fa MetalMaterial__eval(ISPCMetalMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  const FresnelConductor fresnel = make_FresnelConductor(Vec3fa(This->eta),Vec3fa(This->k));
  const PowerCosineDistribution distribution = make_PowerCosineDistribution(rcp(This->roughness));

  const float cosThetaO = dot(wo,dg.Ns);
  const float cosThetaI = dot(wi,dg.Ns);
  if (cosThetaI <= 0.0f || cosThetaO <= 0.0f) return Vec3fa(0.f);
  const Vec3fa wh = normalize(wi+wo);
  const float cosThetaH = dot(wh, dg.Ns);
  const float cosTheta = dot(wi, wh); // = dot(wo, wh);
  const Vec3fa F = eval(fresnel,cosTheta);
  const float D = eval(distribution,cosThetaH);
  const float G = min(1.0f, min(2.0f * cosThetaH * cosThetaO / cosTheta,
                                2.0f * cosThetaH * cosThetaI / cosTheta));
  return (Vec3fa(This->reflectance)*F) * D * G * rcp(4.0f*cosThetaO);
}